

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.c
# Opt level: O0

uint32_t * zxspectrum_claim_screen(zxspectrum_t *state)

{
  int iVar1;
  zxbox_t *in_RDI;
  uint *unaff_retaddr;
  zxspectrum_private_t *prv;
  zxbox_t *dirty;
  
  dirty = in_RDI;
  pthread_mutex_lock((pthread_mutex_t *)&in_RDI[0x1b7].x1);
  iVar1 = zxbox_is_valid(in_RDI + 0x1ba);
  if (iVar1 != 0) {
    zxscreen_convert(prv,unaff_retaddr,dirty);
    zxbox_invalidate(in_RDI + 0x1ba);
  }
  return (uint32_t *)&in_RDI[0x36b].x1;
}

Assistant:

uint32_t *zxspectrum_claim_screen(zxspectrum_t *state)
{
  zxspectrum_private_t *prv = (zxspectrum_private_t *) state;

  mutex_lock(prv->lock);

  /* Check for any changes */
  if (zxbox_is_valid(&prv->dirty))
  {
    // Convert the screen only when it's asked for
#ifdef __riscos
    zxscreen_convert16(prv->screen_copy.pixels, prv->converted, &prv->dirty);
#else
    zxscreen_convert(prv->screen_copy.pixels, prv->converted, &prv->dirty);
#endif

    /* Invalidate the dirty region once complete */
    zxbox_invalidate(&prv->dirty);
  }

  return prv->converted;
}